

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QLocale::Country>::relocate
          (QArrayDataPointer<QLocale::Country> *this,qsizetype offset,Country **data)

{
  bool bVar1;
  Country *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  Country *res;
  
  first = (Country *)(*(long *)(in_RDI + 8) + in_RSI * 2);
  QtPrivate::q_relocate_overlap_n<QLocale::Country,long_long>(first,in_RDI,(Country *)0x4f9366);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QLocale::Country>,QLocale::Country_const*>
                        (data,(QArrayDataPointer<QLocale::Country> *)res), bVar1)) {
    *in_RDX = in_RSI * 2 + *in_RDX;
  }
  *(Country **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }